

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O3

void saa1099v_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte *pbVar1;
  SAA_ENV_GEN *saaEGen;
  size_t __n;
  byte bVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  ulong local_50;
  
  __n = (ulong)samples * 4;
  local_50 = 0;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (samples != 0 && *(char *)((long)param + 0x90) != '\0') {
    pbVar1 = (byte *)((long)param + 8);
    do {
      uVar9 = 0;
      pbVar6 = pbVar1;
      do {
        if (pbVar6[0xd] == 0) {
          bVar2 = pbVar6[4];
          if (bVar2 == 0) {
            uVar8 = 1;
            if (pbVar6[5] == 0) {
              bVar5 = false;
              uVar15 = 1;
            }
            else {
              uVar15 = *(uint *)((long)param + (ulong)(2 < uVar9) * 0x10 + 0x60) & 1;
              bVar5 = true;
            }
LAB_00170384:
            iVar13 = (uVar8 & uVar15) * 2;
          }
          else {
            uVar8 = (uint)pbVar6[0xc];
            if (pbVar6[5] == 0) {
              uVar15 = 1;
              bVar5 = false;
              goto LAB_00170384;
            }
            bVar5 = true;
            if (pbVar6[0xc] == 0) {
              iVar13 = 0;
            }
            else {
              iVar13 = uVar8 + (*(uint *)((long)param + (ulong)(2 < uVar9) * 0x10 + 0x60) & 1);
            }
          }
          if ((((char)uVar9 == '\x05') || (((uint)uVar9 & 0xff) == 2)) &&
             (*(char *)((long)param + (ulong)(2 < uVar9) * 10 + 0x7c) != '\0')) {
            lVar7 = (ulong)(2 < uVar9) * 10;
            iVar4 = *(int *)((long)param + (ulong)(*pbVar6 & 0xfffffffe) * 4 + 0xb4);
            iVar14 = (int)((uint)*(byte *)((long)param + lVar7 + 0x84) * iVar4) >> 4;
            bVar3 = pbVar6[1];
            iVar16 = (int)((uint)*(byte *)((long)param + lVar7 + 0x85) *
                          *(int *)((long)param + (ulong)(bVar3 & 0xfffffffe) * 4 + 0xb4)) >> 4;
            if (bVar2 != 0 || bVar5) {
LAB_0017044f:
              (*outputs)[local_50] = (*outputs)[local_50] + iVar14 * (iVar13 + -1);
              outputs[1][local_50] = outputs[1][local_50] + (iVar13 + -1) * iVar16;
            }
            else {
              (*outputs)[local_50] = (*outputs)[local_50] + (iVar14 * iVar13 - iVar4);
              outputs[1][local_50] =
                   outputs[1][local_50] +
                   (iVar16 * iVar13 - *(int *)((long)param + (ulong)(bVar3 & 0xfffffffe) * 4 + 0xb4)
                   );
            }
          }
          else {
            iVar14 = *(int *)((long)param + (ulong)*pbVar6 * 4 + 0xb4);
            iVar16 = *(int *)((long)param + (ulong)pbVar6[1] * 4 + 0xb4);
            if (!(bool)(bVar2 == 0 & (bVar5 ^ 1U))) goto LAB_0017044f;
            (*outputs)[local_50] = (*outputs)[local_50] + iVar14 * iVar13;
            outputs[1][local_50] = outputs[1][local_50] + iVar16 * iVar13;
          }
        }
        uVar9 = uVar9 + 1;
        pbVar6 = pbVar6 + 0xe;
      } while (uVar9 != 6);
      uVar9 = *(long *)((long)param + 0x100) + *(long *)((long)param + 0xf8);
      *(ulong *)((long)param + 0x100) = uVar9;
      uVar10 = uVar9 >> 0x20;
      if (uVar10 != 0) {
        do {
          if (*(char *)((long)param + 0x91) == '\0') {
            lVar7 = 0x14;
            do {
              sVar12 = (short)(-1 << (*(byte *)((long)param + lVar7 + -9) & 0x1f)) +
                       *(short *)((long)param + lVar7 + -6);
              *(short *)((long)param + lVar7 + -6) = sVar12;
              *(byte *)((long)param + lVar7 + -1) = (byte)((ushort)sVar12 >> 0xf);
              if (sVar12 < 0) {
                *(short *)((long)param + lVar7 + -6) = sVar12 + *(short *)((long)param + lVar7 + -4)
                ;
                bVar2 = *(byte *)((long)param + lVar7 + -2);
                *(byte *)((long)param + lVar7 + -2) = bVar2 ^ 1;
                if (bVar2 == 1) {
                  *(byte *)((long)param + lVar7) = *(byte *)((long)param + lVar7) ^ 1;
                }
              }
              lVar7 = lVar7 + 0xe;
            } while (lVar7 != 0x68);
          }
          lVar7 = 0;
          bVar5 = true;
          do {
            bVar17 = bVar5;
            lVar11 = lVar7 * 0x10;
            sVar12 = -1;
            if (*(char *)((long)param + lVar11 + 0x5c) == '\x03') {
              if (*(char *)((long)param + lVar7 * 0x2a + 0x13) == '\0') {
                sVar12 = 0;
              }
              else {
                sVar12 = -(ushort)(pbVar1[lVar7 * 0x2a + 10] == 0);
              }
            }
            sVar12 = sVar12 + *(short *)((long)param + lVar11 + 100);
            *(short *)((long)param + lVar11 + 100) = sVar12;
            *(byte *)((long)param + lVar11 + 0x69) = (byte)((ushort)sVar12 >> 0xf);
            if (sVar12 < 0) {
              *(short *)((long)param + lVar11 + 100) =
                   sVar12 + *(short *)((long)param + lVar11 + 0x66);
              pbVar6 = (byte *)((long)param + lVar11 + 0x68);
              *pbVar6 = *pbVar6 ^ 1;
              uVar8 = *(uint *)((long)param + lVar11 + 0x60);
              *(uint *)((long)param + lVar11 + 0x60) =
                   ((uVar8 >> 10 ^ uVar8 >> 0x11) & 1) + uVar8 * 2;
            }
            lVar7 = 1;
            bVar5 = false;
          } while (bVar17);
          lVar7 = 0;
          bVar5 = true;
          do {
            bVar17 = bVar5;
            if (((*(char *)((long)param + lVar7 * 10 + 0x7e) == '\0') &&
                (pbVar1[lVar7 * 0x2a + 0x19] != 0)) && (pbVar1[lVar7 * 0x2a + 0x18] == 0)) {
              saaEGen = (SAA_ENV_GEN *)((long)param + lVar7 * 10 + 0x7c);
              if (((char)saaEGen->flags < '\0') && (saaEGen->reload != '\0')) {
                saa_envgen_load((SAA_CHIP *)param,(UINT8)lVar7);
              }
              saa_envgen_step(saaEGen);
            }
            lVar7 = 1;
            bVar5 = false;
          } while (bVar17);
          uVar8 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar8;
        } while (uVar8 != 0);
        uVar9 = (ulong)*(uint *)((long)param + 0x100);
      }
      *(ulong *)((long)param + 0x100) = uVar9 & 0xffffffff;
      local_50 = local_50 + 1;
    } while (local_50 != samples);
  }
  return;
}

Assistant:

static void saa1099v_update(void* param, UINT32 samples, DEV_SMPL** outputs)
{
	SAA_CHIP* saa = (SAA_CHIP*)param;
	SAA_CHN* saaCh;
	UINT32 curSmpl;
	UINT8 curChn;
	UINT8 neChn;	// noise/envelope channel
	UINT8 noDCremove;
	DEV_SMPL outState;
	DEV_SMPL outVolL;
	DEV_SMPL outVolR;
	
	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (! saa->allOn)
		return;
	
	for (curSmpl = 0; curSmpl < samples; curSmpl ++)
	{
		for (curChn = 0; curChn < 6; curChn ++)
		{
			saaCh = &saa->channels[curChn];
			if (saaCh->muted)
				continue;
			neChn = curChn / 3;
			noDCremove = 0;
			
			if (saaCh->toneOn && saaCh->noiseOn)
			{
				// mixing tone+noise works like this
				outState = saaCh->state;
				if (saaCh->state)
					outState += (saa->noise[neChn].state & 0x01);
			}
			else
			{
				outState  = (saaCh->toneOn) ? saaCh->state : 1;
				outState &= (saaCh->noiseOn) ? (saa->noise[neChn].state & 0x01) : 1;
				outState *= 2;	// make the same amplitude as when mixing tone+noise
			}
			
			if ((curChn == 2 || curChn == 5) && saa->env[neChn].enable)
			{
				// enabling the envelope generator disables amplitude bit 0
				outVolL = (saa->volTbl[saaCh->volL & ~0x01] * saa->env[neChn].volL) >> 4;
				outVolR = (saa->volTbl[saaCh->volR & ~0x01] * saa->env[neChn].volR) >> 4;
				if (! saaCh->toneOn && ! saaCh->noiseOn)
					noDCremove = 2;
			}
			else
			{
				outVolL = saa->volTbl[saaCh->volL];
				outVolR = saa->volTbl[saaCh->volR];
				if (! saaCh->toneOn && ! saaCh->noiseOn)
					noDCremove = 1;
			}
			
			// tone XOR noise enabled: outState can be: 0 [off], 2 [on]
			// tone + noise enabled: outState can be: 0 [both off], 1 [only tone on], 2 [both on]
			if (! noDCremove)
			{
				outState = outState - 1;	// DC offset removal and make bipolar
				outputs[0][curSmpl] += outState * outVolL;
				outputs[1][curSmpl] += outState * outVolR;
			}
			else if (noDCremove == 1)
			{
				// just ignore offset removal (makes software-PCM work)
				outputs[0][curSmpl] += outState * outVolL;
				outputs[1][curSmpl] += outState * outVolR;
			}
			else //if (noDCremove == 2)
			{
				// set "center" based on current volume level (for EnvGen-based sounds)
				outputs[0][curSmpl] += outState * outVolL - saa->volTbl[saaCh->volL & ~0x01];
				outputs[1][curSmpl] += outState * outVolR - saa->volTbl[saaCh->volR & ~0x01];
			}
		}
		
		// Updating after calculating the sample output improves emulation of a few artifacts.
		// (like the peak down after the frequency generator reset)
		RC_STEP(&saa->stepCntr);
		saa_advance(saa, RC_GET_VAL(&saa->stepCntr));
		RC_MASK(&saa->stepCntr);
	}
	
	return;
}